

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O2

void test2(void)

{
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [16];
  char *local_68;
  undefined8 local_60;
  int local_58;
  bool local_54;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> xs;
  
  local_78._0_8_ = (optional<int>)0x100000004;
  haskell_traits::v1::detail::
  lazy_helper<haskell_traits::v1::merged_return<haskell_traits::v1::fmap_fn,_haskell_traits::v1::aapply_fn,_haskell_traits::v1::mbind_fn>,_std::optional<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp:52:17)>
  ::
  operator()<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_42,_42>
            ((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&xs,(lazy_helper<haskell_traits::v1::merged_return<haskell_traits::v1::fmap_fn,_haskell_traits::v1::aapply_fn,_haskell_traits::v1::mbind_fn>,_std::optional<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mtak_[P]haskell_traits_test_basic_tests_cpp:52:17)>
                     *)local_78);
  local_78._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp"
  ;
  local_78._8_8_ = "xs == std::string(\"4\")";
  local_68 = "void test2()";
  local_58 = 0x7e;
  local_54 = false;
  local_60 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&xs;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"4",&local_99);
  test_impl::R<std::optional<std::__cxx11::string>&>::operator==
            ((R<std::optional<std::__cxx11::string>&> *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  test_impl::
  R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::~R((R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        *)local_78);
  local_98._M_dataplus._M_p = (pointer)0x100000004;
  haskell_traits::v1::detail::
  lazy_helper<haskell_traits::v1::merged_return<haskell_traits::v1::fmap_fn,_haskell_traits::v1::aapply_fn,_haskell_traits::v1::mbind_fn>,_std::optional<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp:59:17)>
  ::
  operator()<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_42,_42>
            (local_78,(lazy_helper<haskell_traits::v1::merged_return<haskell_traits::v1::fmap_fn,_haskell_traits::v1::aapply_fn,_haskell_traits::v1::mbind_fn>,_std::optional<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mtak_[P]haskell_traits_test_basic_tests_cpp:59:17)>
                       *)&local_98);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&xs,(_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_78);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78);
  local_78._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/mtak-[P]haskell_traits/test/basic_tests.cpp"
  ;
  local_78._8_8_ = "xs == std::to_string(sizeof(int))";
  local_68 = "void test2()";
  local_58 = 0x81;
  local_54 = false;
  local_60 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&xs;
  std::__cxx11::to_string(&local_98,4);
  test_impl::R<std::optional<std::__cxx11::string>&>::operator==
            ((R<std::optional<std::__cxx11::string>&> *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  test_impl::
  R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::~R((R<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        *)local_78);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&xs);
  return;
}

Assistant:

void test2()
{
    constexpr std::optional<int> x{4};
    std::optional<std::string>   xs = bindShowInt(x);
    CHECK(xs == std::string("4"));

    xs = bindShowSizeof(x);
    CHECK(xs == std::to_string(sizeof(int)));

    constexpr std::optional<float> b = ht::fmap(x, [](const int y) { return float(y); });
    static_assert(b == float(4));

    constexpr auto foo = [](std::string_view x) constexpr->int { return x.size(); };
    constexpr std::optional<decltype(foo)>    f{foo};
    constexpr std::optional<std::string_view> i{"foobar"};
    static_assert(ht::aapply(i, f) == 6);
    static_assert(i >> f == 6);
}